

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
     ::doEndThrowingInst(RedundantSetElimination *self,Expression **currp)

{
  Id IVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  TryTable *this;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  
  lVar12 = ((long)(self->
                  super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                  ).
                  super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                  .throwingInstsStack.
                  super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(self->
                  super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                  ).
                  super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                  .throwingInstsStack.
                  super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((long)(self->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
            ).
            super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
            .tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(self->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
            ).
            super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
            .tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != lVar12) {
    __assert_fail("self->tryStack.size() == self->throwingInstsStack.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x11a,
                  "static void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  uVar11 = (int)lVar12 - 1;
  if (-1 < (int)uVar11) {
    do {
      uVar9 = (ulong)uVar11;
      ppEVar2 = (self->
                super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                ).
                super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                .tryStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar3 = ppEVar2[uVar9];
      iVar10 = 0;
      if ((pEVar3->_id == TryId) && (*(long *)(pEVar3 + 7) != 0)) {
        uVar6 = uVar11;
        if (*(uintptr_t *)(pEVar3 + 7) == DAT_010d2868) {
          iVar10 = 2;
        }
        else {
          do {
            uVar5 = uVar6;
            uVar9 = uVar9 - 1;
            uVar6 = uVar11;
            if ((int)uVar5 < 1) break;
            pEVar4 = ppEVar2[uVar9 & 0xffffffff];
            if (pEVar4->_id != TryId) {
              __assert_fail("int(_id) == int(T::SpecificId)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                            ,0x31b,"T *wasm::Expression::cast() [T = wasm::Try]");
            }
            uVar6 = uVar5 - 1;
          } while (pEVar4[1].type.id != *(uintptr_t *)(pEVar3 + 7));
          uVar11 = uVar6;
          iVar10 = 3;
          if ((int)uVar5 < 1) {
            __assert_fail("found",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                          ,0x12e,
                          "static void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                         );
          }
        }
      }
      if (iVar10 == 0) {
        std::
        vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ::push_back((self->
                    super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                    ).
                    super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                    .throwingInstsStack.
                    super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11,
                    &(self->
                     super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                     ).
                     super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                     .currBasicBlock);
        this = (TryTable *)
               (self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
               .tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11];
        IVar1 = (this->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression._id;
        if (IVar1 == TryTableId) {
          bVar7 = TryTable::hasCatchAll(this);
          if (!bVar7) goto LAB_00a7fb45;
          cVar8 = bVar7 * '\x02';
        }
        else {
          if (IVar1 != TryId) {
            handle_unreachable("invalid throwingInstsStack item",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                               ,0x144);
          }
          cVar8 = '\x02';
          if ((long)(this->catchDests).allocator - (long)(this->catchTags).allocator != 1) {
LAB_00a7fb45:
            cVar8 = '\0';
          }
        }
        if (cVar8 != '\0') {
          return;
        }
        uVar11 = uVar11 - 1;
      }
      else if (iVar10 != 3) {
        return;
      }
    } while (-1 < (int)uVar11);
  }
  return;
}

Assistant:

static void doEndThrowingInst(SubType* self, Expression** currp) {
    // If the innermost try/try_table does not have a catch_all clause, an
    // exception thrown can be caught by any of its outer catch block. And if
    // that outer try/try_table also does not have a catch_all, this continues
    // until we encounter a try/try_table-catch_all. Create a link to all those
    // possible catch unwind destinations.
    // TODO This can be more precise for `throw`s if we compare tag types and
    // create links to outer catch BBs only when the exception is not caught.
    // TODO This can also be more precise if we analyze the structure of nested
    // try-catches. For example, in the example below, 'call $foo' doesn't need
    // a link to the BB of outer 'catch $e1', because if the exception thrown by
    // the call is of tag $e1, it would've already been caught by the inner
    // 'catch $e1'. Optimize these cases later.
    // try
    //   try
    //     call $foo
    //   catch $e1
    //     ...
    //   catch $e2
    //     ...
    //   end
    // catch $e1
    //   ...
    // catch $e3
    //   ...
    // end
    assert(self->tryStack.size() == self->throwingInstsStack.size());
    for (int i = self->throwingInstsStack.size() - 1; i >= 0;) {
      if (auto* tryy = self->tryStack[i]->template dynCast<Try>()) {
        if (tryy->isDelegate()) {
          // If this delegates to the caller, there is no possibility that this
          // instruction can throw to outer catches.
          if (tryy->delegateTarget == DELEGATE_CALLER_TARGET) {
            break;
          }
          // If this delegates to an outer try, we skip catches between this try
          // and the target try.
          [[maybe_unused]] bool found = false;
          for (int j = i - 1; j >= 0; j--) {
            if (self->tryStack[j]->template cast<Try>()->name ==
                tryy->delegateTarget) {
              i = j;
              found = true;
              break;
            }
          }
          assert(found);
          continue;
        }
      }

      // Exception thrown. Note outselves so that we will create a link to each
      // catch within the try / each destination block within the try_table when
      // we get there.
      self->throwingInstsStack[i].push_back(self->currBasicBlock);

      if (auto* tryy = self->tryStack[i]->template dynCast<Try>()) {
        // If this try has catch_all, there is no possibility that this
        // instruction can throw to outer catches. Stop here.
        if (tryy->hasCatchAll()) {
          break;
        }
      } else if (auto* tryTable =
                   self->tryStack[i]->template dynCast<TryTable>()) {
        if (tryTable->hasCatchAll()) {
          break;
        }
      } else {
        WASM_UNREACHABLE("invalid throwingInstsStack item");
      }
      i--;
    }
  }